

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O2

void __thiscall
test::iu_FilePath_x_iutest_x_PrintTo_Test::Body(iu_FilePath_x_iutest_x_PrintTo_Test *this)

{
  AssertionResult iutest_ar;
  FilePath path;
  _Alloc_hider in_stack_fffffffffffffdd8;
  AssertionResult local_208;
  iuFilePath local_1e0;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::detail::iuFilePath::iuFilePath(&local_1e0,"test.exe");
  iutest::PrintToString<iutest::detail::iuFilePath>((string *)&stack0xfffffffffffffdd8,&local_1e0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_208,(internal *)"\"test.exe\"","::iutest::PrintToString(path)","test.exe",
             &stack0xfffffffffffffdd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,(type **)in_stack_fffffffffffffdd8._M_p);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
  if (local_208.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xeb,local_208.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  return;
}

Assistant:

IUTEST(FilePath, PrintTo)
{
    ::iutest::internal::FilePath path("test.exe");
    IUTEST_ASSERT_STREQ("test.exe", ::iutest::PrintToString(path));
}